

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexTriangleFilter::apply
          (PtexTriangleFilter *this,PtexTriangleKernel *k,int faceid,FaceInfo *f)

{
  PtexFaceData *pPVar1;
  undefined2 *in_RCX;
  undefined4 in_EDX;
  undefined2 *in_RSI;
  long in_RDI;
  PtexFaceData *in_stack_00000010;
  PtexTriangleKernelIter *in_stack_00000018;
  PtexTriangleFilter *in_stack_00000020;
  PtexPtr<Ptex::v2_2::PtexFaceData> dh;
  PtexTriangleKernelIter kodd;
  PtexTriangleKernelIter keven;
  PtexTriangleKernel *in_stack_ffffffffffffff18;
  PtexTriangleKernel *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  PtexTriangleKernelIter *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff56;
  PtexPtr local_a8 [60];
  byte local_6c;
  byte local_30;
  undefined2 local_22;
  undefined4 local_14;
  undefined2 *local_10;
  
  local_22 = *in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  PtexTriangleKernel::clampRes
            (in_stack_ffffffffffffff18,SUB82((ulong)in_stack_ffffffffffffff20 >> 0x30,0));
  PtexTriangleKernel::clampExtent(in_stack_ffffffffffffff20);
  PtexTriangleKernel::getIterators
            ((PtexTriangleKernel *)CONCAT26(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48,
             (PtexTriangleKernelIter *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
            );
  if (((local_30 & 1) != 0) || ((local_6c & 1) != 0)) {
    pPVar1 = (PtexFaceData *)
             (**(code **)(**(long **)(in_RDI + 8) + 0xa0))
                       (*(long **)(in_RDI + 8),local_14,*local_10);
    PtexPtr<Ptex::v2_2::PtexFaceData>::PtexPtr((PtexPtr<Ptex::v2_2::PtexFaceData> *)local_a8,pPVar1)
    ;
    pPVar1 = PtexPtr::operator_cast_to_PtexFaceData_(local_a8);
    if (pPVar1 != (PtexFaceData *)0x0) {
      if ((local_30 & 1) != 0) {
        in_stack_ffffffffffffff20 =
             (PtexTriangleKernel *)PtexPtr::operator_cast_to_PtexFaceData_(local_a8);
        applyIter(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      }
      if ((local_6c & 1) != 0) {
        PtexPtr::operator_cast_to_PtexFaceData_(local_a8);
        applyIter(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      }
    }
    PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr
              ((PtexPtr<Ptex::v2_2::PtexFaceData> *)in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void PtexTriangleFilter::apply(PtexTriangleKernel& k, int faceid, const Ptex::FaceInfo& f)
{
    // clamp kernel face (resolution and extent)
    k.clampRes(f.res);
    k.clampExtent();

    // build kernel iterators
    PtexTriangleKernelIter keven, kodd;
    k.getIterators(keven, kodd);
    if (!keven.valid && !kodd.valid) return;

    // get face data, and apply
    PtexPtr<PtexFaceData> dh ( _tx->getData(faceid, k.res) );
    if (!dh) return;

    if (keven.valid) applyIter(keven, dh);
    if (kodd.valid) applyIter(kodd, dh);
}